

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::color_rgba>::erase
          (vector<basisu::color_rgba> *this,color_rgba *pFirst,color_rgba *pEnd)

{
  bool bVar1;
  vector<basisu::color_rgba> *pvVar2;
  color_rgba *pcVar3;
  long lVar4;
  vector<basisu::color_rgba> *in_RDX;
  vector<basisu::color_rgba> *in_RSI;
  vector<basisu::color_rgba> *in_RDI;
  int64_t n;
  int64_t ofs;
  vector<basisu::color_rgba> *in_stack_ffffffffffffffb8;
  vector<basisu::color_rgba> *this_00;
  
  if (in_RDX < in_RSI) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x318,
                  "void basisu::vector<basisu::color_rgba>::erase(T *, T *) [T = basisu::color_rgba]"
                 );
  }
  this_00 = in_RSI;
  pvVar2 = (vector<basisu::color_rgba> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= this_00) {
    in_stack_ffffffffffffffb8 = in_RSI;
    pvVar2 = (vector<basisu::color_rgba> *)end(in_RDI);
    bVar1 = in_stack_ffffffffffffffb8 <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pFirst >= begin() && pFirst <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x319,
                  "void basisu::vector<basisu::color_rgba>::erase(T *, T *) [T = basisu::color_rgba]"
                 );
  }
  pvVar2 = (vector<basisu::color_rgba> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= in_RDX) {
    pvVar2 = (vector<basisu::color_rgba> *)end(in_RDI);
    bVar1 = in_RDX <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pEnd >= begin() && pEnd <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x31a,
                  "void basisu::vector<basisu::color_rgba>::erase(T *, T *) [T = basisu::color_rgba]"
                 );
  }
  pcVar3 = begin(in_RDI);
  lVar4 = (long)in_RSI - (long)pcVar3 >> 2;
  if ((lVar4 < 0) || (0xffffffff < lVar4)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,799,
                  "void basisu::vector<basisu::color_rgba>::erase(T *, T *) [T = basisu::color_rgba]"
                 );
  }
  lVar4 = (long)in_RDX - (long)in_RSI >> 2;
  if ((-1 < lVar4) && (lVar4 < 0x100000000)) {
    erase(this_00,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
          (uint32_t)in_stack_ffffffffffffffb8);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x326,
                "void basisu::vector<basisu::color_rgba>::erase(T *, T *) [T = basisu::color_rgba]")
  ;
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }